

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::FixTrailingCommas::remove_comma
          (FixTrailingCommas *this,Fodder *last_comma_fodder,bool *trailing_comma,
          Fodder *close_fodder)

{
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_RCX;
  byte *in_RDX;
  Fodder *in_RSI;
  Fodder *in_RDI;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_ffffffffffffffd8;
  
  if ((*in_RDX & 1) != 0) {
    *in_RDX = 0;
    concat_fodder(in_RDI,in_RSI);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::operator=(in_RCX,in_stack_ffffffffffffffd8);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(in_RCX);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::clear((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             *)0x36be5b);
  }
  return;
}

Assistant:

void remove_comma(Fodder &last_comma_fodder, bool &trailing_comma, Fodder &close_fodder)
    {
        if (trailing_comma) {
            // Remove it but keep fodder.
            trailing_comma = false;
            close_fodder = concat_fodder(last_comma_fodder, close_fodder);
            last_comma_fodder.clear();
        }
    }